

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_greedy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  BYTE *pBVar2;
  undefined8 *puVar3;
  seqDef *psVar4;
  ulong uVar5;
  char cVar6;
  undefined8 uVar7;
  U32 lowestValid;
  uint uVar8;
  uint uVar9;
  ulong *puVar10;
  uint uVar11;
  long lVar12;
  ulong *puVar13;
  int iVar14;
  BYTE *litEnd;
  ulong *puVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong *puVar22;
  U32 UVar23;
  ulong uVar24;
  BYTE *litEnd_1;
  BYTE *pInLoopLimit;
  ulong *puVar25;
  ulong *puVar26;
  BYTE *pBVar27;
  size_t offbaseFound;
  BYTE *litLimit_w;
  uint local_ac;
  size_t local_a0;
  uint local_94;
  BYTE *local_90;
  uint local_88;
  uint local_84;
  ulong local_80;
  ulong *local_78;
  ulong *local_70;
  ulong *local_68;
  uint local_5c;
  uint local_58;
  uint local_54;
  BYTE *local_50;
  ulong *local_48;
  ulong *local_40;
  uint *local_38;
  
  local_90 = (ms->window).base;
  uVar8 = (ms->window).dictLimit;
  local_50 = local_90 + uVar8;
  local_84 = (ms->cParams).minMatch;
  if (5 < local_84) {
    local_84 = 6;
  }
  if (local_84 < 5) {
    local_84 = 4;
  }
  local_94 = (ms->cParams).searchLog;
  local_88 = 6;
  if (local_94 < 6) {
    local_88 = local_94;
  }
  if (local_88 < 5) {
    local_88 = 4;
  }
  puVar25 = (ulong *)((ulong)((int)src == (int)local_50) + (long)src);
  uVar20 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar14 = (int)puVar25 - (int)local_90;
  local_58 = *rep;
  local_54 = iVar14 - uVar20;
  if (iVar14 - uVar8 <= uVar20) {
    local_54 = uVar8;
  }
  uVar20 = 0;
  if (ms->loadedDictEnd != 0) {
    local_54 = uVar8;
  }
  local_5c = rep[1];
  local_54 = iVar14 - local_54;
  uVar8 = local_5c;
  if (local_54 < local_5c) {
    uVar8 = uVar20;
  }
  local_80 = CONCAT44(local_80._4_4_,uVar8);
  local_ac = local_58;
  if (local_54 < local_58) {
    local_ac = uVar20;
  }
  ms->lazySkipping = 0;
  local_78 = (ulong *)((long)src + (srcSize - 0x10));
  uVar9 = ms->nextToUpdate;
  uVar16 = (ulong)uVar9;
  uVar11 = ((int)local_78 - (int)(local_90 + uVar16)) + 1;
  uVar21 = 8;
  if (uVar11 < 8) {
    uVar21 = uVar11;
  }
  if (local_78 < local_90 + uVar16) {
    uVar21 = uVar20;
  }
  if (uVar9 < uVar21 + uVar9) {
    uVar18 = ms->hashSalt;
    cVar6 = (char)ms->rowHashLog;
    do {
      if (local_84 == 5) {
        uVar24 = *(long *)(local_90 + uVar16) * -0x30e4432345000000;
LAB_018ee565:
        UVar23 = (U32)((uVar24 ^ uVar18) >> (0x38U - cVar6 & 0x3f));
      }
      else {
        if (local_84 == 6) {
          uVar24 = *(long *)(local_90 + uVar16) * -0x30e4432340650000;
          goto LAB_018ee565;
        }
        UVar23 = (*(int *)(local_90 + uVar16) * -0x61c8864f ^ (uint)uVar18) >>
                 (0x18U - cVar6 & 0x1f);
      }
      ms->hashCache[(uint)uVar16 & 7] = UVar23;
      uVar16 = uVar16 + 1;
    } while (uVar21 + uVar9 != uVar16);
  }
  puVar22 = (ulong *)(srcSize + (long)src);
  local_38 = rep;
  if (puVar25 < local_78) {
    puVar1 = (ulong *)((long)puVar22 - 7);
    local_40 = (ulong *)((long)puVar22 + -3);
    local_48 = (ulong *)((long)puVar22 + -1);
    local_68 = puVar22 + -4;
    local_70 = puVar22;
    do {
      if (local_ac == 0) {
LAB_018ee6b2:
        local_a0 = 999999999;
        if (local_84 == 6) {
          if (local_88 == 6) {
            uVar18 = ZSTD_RowFindBestMatch_noDict_6_6(ms,(BYTE *)puVar25,(BYTE *)puVar22,&local_a0);
          }
          else if (local_88 == 5) {
            uVar18 = ZSTD_RowFindBestMatch_noDict_6_5(ms,(BYTE *)puVar25,(BYTE *)puVar22,&local_a0);
          }
          else {
            uVar18 = ZSTD_RowFindBestMatch_noDict_6_4(ms,(BYTE *)puVar25,(BYTE *)puVar22,&local_a0);
          }
        }
        else if (local_84 == 5) {
          if (local_88 == 6) {
            uVar18 = ZSTD_RowFindBestMatch_noDict_5_6(ms,(BYTE *)puVar25,(BYTE *)puVar22,&local_a0);
          }
          else if (local_88 == 5) {
            uVar18 = ZSTD_RowFindBestMatch_noDict_5_5(ms,(BYTE *)puVar25,(BYTE *)puVar22,&local_a0);
          }
          else {
            uVar18 = ZSTD_RowFindBestMatch_noDict_5_4(ms,(BYTE *)puVar25,(BYTE *)puVar22,&local_a0);
          }
        }
        else if (local_88 == 6) {
          uVar18 = ZSTD_RowFindBestMatch_noDict_4_6(ms,(BYTE *)puVar25,(BYTE *)puVar22,&local_a0);
        }
        else if (local_88 == 5) {
          uVar18 = ZSTD_RowFindBestMatch_noDict_4_5(ms,(BYTE *)puVar25,(BYTE *)puVar22,&local_a0);
        }
        else {
          uVar18 = ZSTD_RowFindBestMatch_noDict_4_4(ms,(BYTE *)puVar25,(BYTE *)puVar22,&local_a0);
        }
        uVar16 = 1;
        if (uVar18 != 0) {
          uVar16 = local_a0;
        }
        puVar22 = local_70;
        if (3 < uVar18) {
          puVar15 = puVar25;
          if (3 < uVar16) {
            if ((src < puVar25) && (local_50 < (BYTE *)((long)puVar25 + (3 - uVar16)))) {
              while (puVar15 = puVar25,
                    *(char *)((long)puVar25 - 1) == *(char *)((long)puVar25 + (2 - uVar16))) {
                puVar15 = (ulong *)((long)puVar25 - 1);
                uVar18 = uVar18 + 1;
                if ((puVar15 <= src) ||
                   (pBVar27 = (BYTE *)((long)puVar25 + (2 - uVar16)), puVar25 = puVar15,
                   pBVar27 <= local_50)) break;
              }
            }
            uVar8 = local_ac;
            local_ac = (int)uVar16 - 3;
          }
          goto LAB_018ee75b;
        }
        uVar16 = (long)puVar25 - (long)src;
        puVar25 = (ulong *)((long)puVar25 + (uVar16 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar16);
      }
      else {
        puVar15 = (ulong *)((long)puVar25 + 1);
        uVar16 = (ulong)local_ac;
        if (*(int *)((long)puVar15 - uVar16) != *(int *)((long)puVar25 + 1)) goto LAB_018ee6b2;
        puVar13 = (ulong *)((long)puVar25 + 5);
        puVar10 = (ulong *)((long)puVar25 + (5 - uVar16));
        puVar26 = puVar13;
        if (puVar13 < puVar1) {
          uVar24 = *puVar13 ^ *puVar10;
          uVar18 = 0;
          if (uVar24 != 0) {
            for (; (uVar24 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
            }
          }
          uVar18 = uVar18 >> 3 & 0x1fffffff;
          if (*puVar10 == *puVar13) {
            puVar26 = (ulong *)((long)puVar25 + 0xd);
            puVar10 = (ulong *)((long)puVar25 + (0xd - uVar16));
            do {
              if (puVar1 <= puVar26) goto LAB_018ee707;
              uVar16 = *puVar10;
              uVar24 = *puVar26;
              uVar17 = uVar24 ^ uVar16;
              uVar18 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              uVar18 = (long)puVar26 + ((uVar18 >> 3 & 0x1fffffff) - (long)puVar13);
              puVar26 = puVar26 + 1;
              puVar10 = puVar10 + 1;
            } while (uVar16 == uVar24);
          }
        }
        else {
LAB_018ee707:
          if ((puVar26 < local_40) && ((int)*puVar10 == (int)*puVar26)) {
            puVar26 = (ulong *)((long)puVar26 + 4);
            puVar10 = (ulong *)((long)puVar10 + 4);
          }
          if ((puVar26 < local_48) && ((short)*puVar10 == (short)*puVar26)) {
            puVar26 = (ulong *)((long)puVar26 + 2);
            puVar10 = (ulong *)((long)puVar10 + 2);
          }
          if (puVar26 < puVar22) {
            puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar10 == (char)*puVar26));
          }
          uVar18 = (long)puVar26 - (long)puVar13;
        }
        uVar18 = uVar18 + 4;
        uVar16 = 1;
LAB_018ee75b:
        uVar24 = (long)puVar15 - (long)src;
        if (local_68 < puVar15) {
          local_80 = uVar16;
          ZSTD_safecopyLiterals(seqStore->lit,(BYTE *)src,(BYTE *)puVar15,(BYTE *)local_68);
          uVar16 = local_80;
          puVar22 = local_70;
        }
        else {
          puVar25 = (ulong *)seqStore->lit;
          uVar17 = *(ulong *)((long)src + 8);
          *puVar25 = *src;
          puVar25[1] = uVar17;
          if (0x10 < uVar24) {
            pBVar27 = seqStore->lit;
            uVar17 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar27 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar27 + 0x18) = uVar17;
            if (0x20 < (long)uVar24) {
              lVar12 = 0;
              do {
                puVar3 = (undefined8 *)((long)src + lVar12 + 0x20);
                uVar7 = puVar3[1];
                pBVar2 = pBVar27 + lVar12 + 0x20;
                *(undefined8 *)pBVar2 = *puVar3;
                *(undefined8 *)(pBVar2 + 8) = uVar7;
                puVar3 = (undefined8 *)((long)src + lVar12 + 0x30);
                uVar7 = puVar3[1];
                *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar2 + 0x18) = uVar7;
                lVar12 = lVar12 + 0x20;
              } while (pBVar2 + 0x20 < pBVar27 + uVar24);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar24;
        if (0xffff < uVar24) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar4 = seqStore->sequences;
        psVar4->litLength = (U16)uVar24;
        psVar4->offBase = (U32)uVar16;
        if (0xffff < uVar18 - 3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(uVar18 - 3);
        seqStore->sequences = psVar4 + 1;
        if (ms->lazySkipping != 0) {
          local_80 = CONCAT44(local_80._4_4_,uVar8);
          uVar20 = ms->nextToUpdate;
          uVar16 = (ulong)uVar20;
          uVar9 = ((int)local_78 - (int)(local_90 + uVar16)) + 1;
          if (7 < uVar9) {
            uVar9 = 8;
          }
          if (local_78 < local_90 + uVar16) {
            uVar9 = 0;
          }
          if (uVar20 < uVar9 + uVar20) {
            uVar24 = ms->hashSalt;
            cVar6 = (char)ms->rowHashLog;
            do {
              if (local_84 == 5) {
                uVar17 = *(long *)(local_90 + uVar16) * -0x30e4432345000000;
LAB_018ee8ff:
                UVar23 = (U32)((uVar17 ^ uVar24) >> (0x38U - cVar6 & 0x3f));
              }
              else {
                if (local_84 == 6) {
                  uVar17 = *(long *)(local_90 + uVar16) * -0x30e4432340650000;
                  goto LAB_018ee8ff;
                }
                UVar23 = (*(int *)(local_90 + uVar16) * -0x61c8864f ^ (uint)uVar24) >>
                         (0x18U - cVar6 & 0x1f);
              }
              ms->hashCache[(uint)uVar16 & 7] = UVar23;
              uVar16 = uVar16 + 1;
            } while (uVar9 + uVar20 != uVar16);
          }
          ms->lazySkipping = 0;
          puVar22 = local_70;
        }
        puVar25 = (ulong *)((long)puVar15 + uVar18);
        src = puVar25;
        if ((uVar8 != 0) && (puVar25 <= local_78)) {
          uVar16 = (ulong)local_ac;
          uVar18 = (ulong)uVar8;
          while( true ) {
            uVar24 = uVar16;
            uVar9 = (uint)uVar18;
            uVar20 = (uint)uVar24;
            src = puVar25;
            uVar8 = uVar9;
            local_ac = uVar20;
            if ((int)*puVar25 != *(int *)((long)puVar25 - uVar18)) break;
            puVar15 = (ulong *)((long)puVar25 + 4);
            puVar26 = (ulong *)((long)puVar25 + (4 - uVar18));
            puVar13 = puVar15;
            if (puVar15 < puVar1) {
              uVar17 = *puVar15 ^ *puVar26;
              uVar16 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar16 = uVar16 >> 3 & 0x1fffffff;
              if (*puVar26 == *puVar15) {
                puVar13 = (ulong *)((long)puVar25 + 0xc);
                puVar26 = (ulong *)((long)puVar25 + (0xc - uVar18));
                do {
                  if (puVar1 <= puVar13) goto LAB_018eea2c;
                  uVar17 = *puVar26;
                  uVar5 = *puVar13;
                  uVar19 = uVar5 ^ uVar17;
                  uVar16 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                    }
                  }
                  uVar16 = (long)puVar13 + ((uVar16 >> 3 & 0x1fffffff) - (long)puVar15);
                  puVar13 = puVar13 + 1;
                  puVar26 = puVar26 + 1;
                } while (uVar17 == uVar5);
              }
            }
            else {
LAB_018eea2c:
              if ((puVar13 < local_40) && ((int)*puVar26 == (int)*puVar13)) {
                puVar13 = (ulong *)((long)puVar13 + 4);
                puVar26 = (ulong *)((long)puVar26 + 4);
              }
              if ((puVar13 < local_48) && ((short)*puVar26 == (short)*puVar13)) {
                puVar13 = (ulong *)((long)puVar13 + 2);
                puVar26 = (ulong *)((long)puVar26 + 2);
              }
              if (puVar13 < puVar22) {
                puVar13 = (ulong *)((long)puVar13 + (ulong)((char)*puVar26 == (char)*puVar13));
              }
              uVar16 = (long)puVar13 - (long)puVar15;
            }
            puVar15 = (ulong *)seqStore->lit;
            if (local_68 < puVar25) {
              ZSTD_safecopyLiterals
                        ((BYTE *)puVar15,(BYTE *)puVar25,(BYTE *)puVar25,(BYTE *)local_68);
              puVar22 = local_70;
            }
            else {
              uVar17 = puVar25[1];
              *puVar15 = *puVar25;
              puVar15[1] = uVar17;
            }
            psVar4 = seqStore->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (0xffff < uVar16 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(uVar16 + 1);
            seqStore->sequences = psVar4 + 1;
            puVar25 = (ulong *)((long)puVar25 + uVar16 + 4);
            src = puVar25;
            uVar8 = uVar20;
            local_ac = uVar9;
            if ((uVar20 == 0) || (uVar16 = uVar18, uVar18 = uVar24, local_78 < puVar25)) break;
          }
        }
      }
    } while (puVar25 < local_78);
  }
  if (local_5c <= local_54) {
    local_5c = 0;
  }
  uVar20 = local_5c;
  if (local_ac != 0) {
    uVar20 = local_58;
  }
  if (local_58 <= local_54) {
    uVar20 = local_5c;
    local_58 = 0;
  }
  if (local_ac != 0) {
    local_58 = local_ac;
  }
  if (uVar8 != 0) {
    uVar20 = uVar8;
  }
  *local_38 = local_58;
  local_38[1] = uVar20;
  return (long)puVar22 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0, ZSTD_noDict);
}